

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int wally_addr_segwit_to_bytes
              (char *addr,char *addr_family,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  int iVar1;
  int local_7c;
  uint8_t local_78 [4];
  int ret;
  uchar decoded [40];
  int local_44;
  size_t *psStack_40;
  int witver;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  char *pcStack_20;
  uint32_t flags_local;
  char *addr_family_local;
  char *addr_local;
  
  local_44 = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((flags == 0) && (addr_family != (char *)0x0)) && (addr != (char *)0x0)) &&
     (((bytes_out != (uchar *)0x0 && (len != 0)) && (written != (size_t *)0x0)))) {
    psStack_40 = written;
    written_local = (size_t *)len;
    len_local = (size_t)bytes_out;
    bytes_out_local._4_4_ = flags;
    pcStack_20 = addr_family;
    addr_family_local = addr;
    iVar1 = segwit_addr_decode(&local_44,local_78,written,addr_family,addr);
    if (iVar1 == 0) {
      local_7c = -2;
    }
    else {
      local_7c = wally_witness_program_from_bytes_using_version
                           (local_78,*psStack_40,(uint8_t)local_44,bytes_out_local._4_4_,
                            (uchar *)len_local,(size_t)written_local,psStack_40);
    }
    wally_clear(local_78,0x28);
    addr_local._4_4_ = local_7c;
  }
  else {
    addr_local._4_4_ = -2;
  }
  return addr_local._4_4_;
}

Assistant:

int wally_addr_segwit_to_bytes(const char *addr, const char *addr_family,
                               uint32_t flags,
                               unsigned char *bytes_out, size_t len,
                               size_t *written)
{
    int witver = 0;
    unsigned char decoded[40];
    int ret;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    /* Only v0 witness programs are currently allowed */
    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr))
        ret = WALLY_EINVAL;
    else
        ret = wally_witness_program_from_bytes_using_version(
            decoded, *written, witver, flags, bytes_out, len, written);

    wally_clear(decoded, sizeof(decoded));
    return ret;
}